

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int duckdb_je_ctl_mibnametomib(tsd_t *tsd,size_t *mib,size_t miblen,char *name,size_t *miblenp)

{
  _Bool _Var1;
  int iVar2;
  ctl_named_node_t *node;
  
  if ((ctl_initialized == '\0') && (_Var1 = ctl_init(tsd), _Var1)) {
    return 0xb;
  }
  iVar2 = ctl_lookupbymib((tsdn_t *)tsd,&node,mib,miblen);
  if (((iVar2 == 0) && (iVar2 = 2, node != (ctl_named_node_t *)0x0)) &&
     (node->ctl == (_func_int_tsd_t_ptr_size_t_ptr_size_t_void_ptr_size_t_ptr_void_ptr_size_t *)0x0)
     ) {
    *miblenp = *miblenp - miblen;
    iVar2 = ctl_lookup((tsdn_t *)tsd,node,name,(ctl_named_node_t **)0x0,mib + miblen,miblenp);
    *miblenp = *miblenp + miblen;
  }
  return iVar2;
}

Assistant:

int
ctl_mibnametomib(tsd_t *tsd, size_t *mib, size_t miblen, const char *name,
    size_t *miblenp) {
	int ret;
	const ctl_named_node_t *node;

	if (!ctl_initialized && ctl_init(tsd)) {
		ret = EAGAIN;
		goto label_return;
	}

	ret = ctl_lookupbymib(tsd_tsdn(tsd), &node, mib, miblen);
	if (ret != 0) {
		goto label_return;
	}
	if (node == NULL || node->ctl != NULL) {
		ret = ENOENT;
		goto label_return;
	}

	assert(miblenp != NULL);
	assert(*miblenp >= miblen);
	*miblenp -= miblen;
	ret = ctl_lookup(tsd_tsdn(tsd), node, name, NULL, mib + miblen,
	    miblenp);
	*miblenp += miblen;
label_return:
	return(ret);
}